

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O3

int opn2_describeChannels(OPN2_MIDIPlayer *device,char *str,char *attr,size_t size)

{
  int iVar1;
  
  if (device == (OPN2_MIDIPlayer *)0x0) {
    iVar1 = -1;
  }
  else {
    if ((OPNMIDIplay *)device->opn2_midiPlayer == (OPNMIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x332,
                    "int opn2_describeChannels(struct OPN2_MIDIPlayer *, char *, char *, size_t)");
    }
    OPNMIDIplay::describeChannels((OPNMIDIplay *)device->opn2_midiPlayer,str,attr,size);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

OPNMIDI_EXPORT int opn2_describeChannels(struct OPN2_MIDIPlayer *device, char *str, char *attr, size_t size)
{
    if(!device)
        return -1;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->describeChannels(str, attr, size);
    return 0;
}